

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::internal::UntypedMapBase::DeleteTable
          (UntypedMapBase *this,NodeBase **table,map_index_t n)

{
  if (&this->arena_->impl_ != (ThreadSafeArena *)0x0) {
    ThreadSafeArena::ReturnArrayMemory(&this->arena_->impl_,table,(ulong)n << 3);
    return;
  }
  operator_delete(table,(ulong)n << 3);
  return;
}

Assistant:

void InternalSwap(UntypedMapBase* other) {
    std::swap(num_elements_, other->num_elements_);
    std::swap(num_buckets_, other->num_buckets_);
    std::swap(index_of_first_non_null_, other->index_of_first_non_null_);
    std::swap(type_info_, other->type_info_);
    std::swap(table_, other->table_);
    std::swap(arena_, other->arena_);
  }